

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * AnalyzeEnumDefinition(ExpressionContext *ctx,SynEnumDefinition *syntax)

{
  __jmp_buf_tag *__env;
  SmallArray<ExprBase_*,_128U> *this;
  bool bVar1;
  Allocator *pAVar2;
  ArgumentData *pAVar3;
  ExprBase **ppEVar4;
  undefined8 uVar5;
  FunctionData *pFVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  TypeBase *pTVar10;
  undefined4 extraout_var;
  SynBase *pSVar11;
  SynIdentifier *pSVar12;
  undefined4 extraout_var_01;
  TypeFunction *pTVar13;
  FunctionData *pFVar14;
  TypeRef *pTVar15;
  ulong uVar16;
  ExprVariableDefinition *pEVar17;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ExprBase *pEVar19;
  SynBase *pSVar20;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  ScopeData *pSVar21;
  char *pcVar22;
  char *in_R8;
  undefined8 *puVar23;
  ulong uVar24;
  ArrayView<ArgumentData> arguments_00;
  InplaceStr name;
  ArrayView<ArgumentData> arguments_01;
  ArrayView<ArgumentData> arguments_02;
  InplaceStr name_00;
  ArrayView<ArgumentData> arguments_03;
  InplaceStr IVar25;
  IntrusiveList<SynConstant> constants;
  SmallArray<ArgumentData,_1U> arguments;
  IntrusiveList<ExprBase> expressions;
  IntrusiveList<ExprVariableDefinition> variables;
  jmp_buf prevErrorHandler;
  SmallArray<ArgumentData,_1U> local_1d0;
  IntrusiveList<ExprBase> local_188;
  IntrusiveList<ExprVariableDefinition> local_178;
  SmallArray<ExprBase_*,_128U> *local_168;
  ScopeData *local_160;
  SynBase *local_158;
  TypeBase *pTStack_150;
  ExprBase *local_148;
  ExprBase *pEStack_140;
  ExprBase *local_138;
  char *local_130;
  char *local_128;
  __jmp_buf_tag *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  SynIdentifier local_f8 [2];
  TypeEnum *this_00;
  _func_int **pp_Var18;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_05;
  
  IVar25.end = in_R8;
  IVar25.begin = (syntax->name->name).end;
  anon_unknown.dwarf_9c70f::CheckTypeConflict
            ((anon_unknown_dwarf_9c70f *)ctx,(ExpressionContext *)syntax,
             (SynBase *)(syntax->name->name).begin,IVar25);
  IVar25 = GetTypeNameInScope(ctx,ctx->scope,syntax->name->name);
  uVar7 = NULLC::GetStringHash(IVar25.begin,IVar25.end);
  pTVar10 = anon_unknown.dwarf_9c70f::LookupTypeByName
                      ((anon_unknown_dwarf_9c70f *)ctx->scope,
                       (ExpressionContext *)ctx->lookupLocation,uVar7);
  if (pTVar10 != (TypeBase *)0x0) {
    anon_unknown.dwarf_9c70f::Stop
              (ctx,&syntax->super_SynBase,"ERROR: \'%.*s\' is being redefined",
               (ulong)(uint)(*(int *)&(syntax->name->name).end - (int)(syntax->name->name).begin));
  }
  iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xe8);
  this_00 = (TypeEnum *)CONCAT44(extraout_var,iVar8);
  local_f8[0].super_SynBase.begin = (syntax->name->super_SynBase).begin;
  local_f8[0].super_SynBase.end = (syntax->name->super_SynBase).end;
  local_f8[0].super_SynBase._vptr_SynBase = (_func_int **)&PTR__SynBase_00222308;
  local_f8[0].super_SynBase.typeID = 4;
  if (local_f8[0].super_SynBase.begin == (Lexeme *)0x0) {
    local_f8[0].super_SynBase.pos.begin = (char *)0x0;
  }
  else {
    local_f8[0].super_SynBase.pos.begin = (local_f8[0].super_SynBase.begin)->pos;
  }
  if (local_f8[0].super_SynBase.end == (Lexeme *)0x0) {
    local_f8[0].super_SynBase.pos.end = (char *)0x0;
  }
  else {
    local_f8[0].super_SynBase.pos.end =
         (local_f8[0].super_SynBase.end)->pos + (local_f8[0].super_SynBase.end)->length;
  }
  if (local_f8[0].super_SynBase.pos.end < local_f8[0].super_SynBase.pos.begin) {
    __assert_fail("strEnd >= strBegin",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/StrAlgo.h"
                  ,0x28,"InplaceStr::InplaceStr(const char *, const char *)");
  }
  local_f8[0].super_SynBase.next = (SynBase *)0x0;
  local_f8[0].super_SynBase.listed = false;
  local_f8[0].super_SynBase.isInternal = false;
  local_f8[0].super_SynBase._vptr_SynBase = (_func_int **)&PTR__SynBase_002222c0;
  pSVar21 = ctx->scope;
  local_130 = IVar25.end;
  local_128 = IVar25.begin;
  local_f8[0].name = IVar25;
  TypeEnum::TypeEnum(this_00,local_f8,&syntax->super_SynBase,pSVar21);
  ExpressionContext::AddType(ctx,(TypeBase *)this_00);
  ExpressionContext::PushScope(ctx,(TypeBase *)this_00);
  (this_00->super_TypeStruct).typeScope = ctx->scope;
  constants.tail = (SynConstant *)pSVar21;
  constants.head = (syntax->values).head;
  AnalyzeEnumConstants(ctx,(TypeBase *)this_00,constants,&(this_00->super_TypeStruct).constants);
  (this_00->super_TypeStruct).super_TypeBase.alignment = ctx->typeInt->alignment;
  ExpressionContext::PopScope(ctx,SCOPE_TYPE,true);
  local_160 = ctx->scope;
  ctx->scope = ctx->globalScope;
  ctx->lookupLocation = (SynBase *)0x0;
  __env = ctx->errorHandler;
  memcpy(local_f8,__env,200);
  bVar1 = ctx->errorHandlerNested;
  ctx->errorHandlerNested = true;
  uVar7 = *(uint *)(NULLC::traceContext + 0x244);
  iVar8 = _setjmp((__jmp_buf_tag *)__env);
  if (iVar8 != 0) {
    NULLC::TraceLeaveTo(uVar7);
    ctx->scope = local_160;
    ctx->lookupLocation = (SynBase *)0x0;
    memcpy(__env,local_f8,200);
    ctx->errorHandlerNested = bVar1;
    longjmp((__jmp_buf_tag *)__env,1);
  }
  pSVar11 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
  local_1d0.allocator = ctx->allocator;
  local_1d0.data = local_1d0.little;
  local_1d0.little[0].source = (SynBase *)0x0;
  local_1d0.little[0].isExplicit = false;
  local_1d0.little[0].name = (SynIdentifier *)0x0;
  local_1d0.little[0].type = (TypeBase *)0x0;
  local_1d0.little[0].value = (ExprBase *)0x0;
  local_1d0.little[0].valueFunction = (FunctionData *)0x0;
  local_1d0.count = 0;
  local_1d0.max = 1;
  iVar8 = (*(local_1d0.allocator)->_vptr_Allocator[2])(local_1d0.allocator,0x50);
  pSVar12 = (SynIdentifier *)CONCAT44(extraout_var_00,iVar8);
  (pSVar12->super_SynBase).typeID = 4;
  (pSVar12->super_SynBase).begin = (Lexeme *)0x0;
  (pSVar12->super_SynBase).end = (Lexeme *)0x0;
  (pSVar12->super_SynBase).pos.begin = (char *)0x0;
  (pSVar12->super_SynBase).pos.end = (char *)0x0;
  *(undefined8 *)((long)&(pSVar12->super_SynBase).pos.end + 2) = 0;
  *(undefined8 *)((long)&(pSVar12->super_SynBase).next + 2) = 0;
  (pSVar12->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002222c0;
  (pSVar12->name).begin = "$x";
  (pSVar12->name).end = "";
  if (local_1d0.count == local_1d0.max) {
    SmallArray<ArgumentData,_1U>::grow(&local_1d0,local_1d0.count);
  }
  if (local_1d0.data == (ArgumentData *)0x0) {
LAB_0016b545:
    pcVar22 = "void SmallArray<ArgumentData, 1>::push_back(const T &) [T = ArgumentData, N = 1]";
  }
  else {
    uVar16 = (ulong)local_1d0.count;
    local_1d0.count = local_1d0.count + 1;
    local_1d0.data[uVar16].source = pSVar11;
    local_1d0.data[uVar16].isExplicit = false;
    local_1d0.data[uVar16].name = pSVar12;
    local_1d0.data[uVar16].type = (TypeBase *)this_00;
    local_1d0.data[uVar16].value = (ExprBase *)0x0;
    (&local_1d0.data[uVar16].value)[1] = (ExprBase *)0x0;
    local_120 = __env;
    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    pSVar12 = (SynIdentifier *)CONCAT44(extraout_var_01,iVar8);
    (pSVar12->super_SynBase).typeID = 4;
    (pSVar12->super_SynBase).begin = (Lexeme *)0x0;
    (pSVar12->super_SynBase).end = (Lexeme *)0x0;
    (pSVar12->super_SynBase).pos.begin = (char *)0x0;
    (pSVar12->super_SynBase).pos.end = (char *)0x0;
    *(undefined8 *)((long)&(pSVar12->super_SynBase).pos.end + 2) = 0;
    *(undefined8 *)((long)&(pSVar12->super_SynBase).next + 2) = 0;
    (pSVar12->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002222c0;
    (pSVar12->name).begin = "int";
    (pSVar12->name).end = "";
    arguments_00.count = local_1d0.count;
    arguments_00.data = local_1d0.data;
    arguments_00._12_4_ = 0;
    pTVar13 = ExpressionContext::GetFunctionType(ctx,pSVar11,ctx->typeInt,arguments_00);
    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x338);
    pFVar14 = (FunctionData *)CONCAT44(extraout_var_02,iVar8);
    pAVar2 = ctx->allocator;
    pSVar21 = ctx->scope;
    pTVar15 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
    local_108 = 0;
    uStack_100 = 0;
    uVar7 = ctx->uniqueFunctionId;
    ctx->uniqueFunctionId = uVar7 + 1;
    pcVar22 = (char *)0x0;
    FunctionData::FunctionData
              (pFVar14,pAVar2,pSVar11,pSVar21,false,false,false,pTVar13,&pTVar15->super_TypeBase,
               pSVar12,(IntrusiveList<MatchData>)ZEXT816(0),uVar7);
    if (local_1d0.count != 0) {
      uVar24 = 0;
      uVar16 = uVar24;
      do {
        puVar23 = (undefined8 *)((long)&(local_1d0.data)->source + uVar24);
        uVar7 = (pFVar14->arguments).count;
        if (uVar7 == (pFVar14->arguments).max) {
          SmallArray<ArgumentData,_4U>::grow(&pFVar14->arguments,uVar7);
        }
        pAVar3 = (pFVar14->arguments).data;
        if (pAVar3 == (ArgumentData *)0x0) goto LAB_0016b526;
        uVar7 = (pFVar14->arguments).count;
        (pFVar14->arguments).count = uVar7 + 1;
        pSVar20 = (SynBase *)*puVar23;
        uVar5 = puVar23[1];
        pSVar12 = (SynIdentifier *)puVar23[2];
        pTVar10 = (TypeBase *)puVar23[3];
        pFVar6 = (FunctionData *)puVar23[5];
        pAVar3[uVar7].value = (ExprBase *)puVar23[4];
        (&pAVar3[uVar7].value)[1] = (ExprBase *)pFVar6;
        pAVar3[uVar7].name = pSVar12;
        (&pAVar3[uVar7].name)[1] = (SynIdentifier *)pTVar10;
        pAVar3[uVar7].source = pSVar20;
        *(undefined8 *)&pAVar3[uVar7].isExplicit = uVar5;
        uVar16 = uVar16 + 1;
        uVar24 = uVar24 + 0x30;
      } while (uVar16 < local_1d0.count);
    }
    name.end = pcVar22;
    name.begin = (pFVar14->name->name).end;
    anon_unknown.dwarf_9c70f::CheckFunctionConflict
              ((anon_unknown_dwarf_9c70f *)ctx,(ExpressionContext *)syntax,
               (SynBase *)(pFVar14->name->name).begin,name);
    ExpressionContext::AddFunction(ctx,pFVar14);
    ExpressionContext::PushScope(ctx,pFVar14);
    pFVar14->functionScope = ctx->scope;
    local_178.head = (ExprVariableDefinition *)0x0;
    local_178.tail = (ExprVariableDefinition *)0x0;
    arguments_01.count = local_1d0.count;
    arguments_01.data = local_1d0.data;
    arguments_01._12_4_ = 0;
    CreateFunctionArgumentVariables(ctx,pSVar11,pFVar14,arguments_01,&local_178);
    pEVar17 = CreateFunctionContextArgument(ctx,pSVar11,pFVar14);
    pFVar14->argumentsSize = pFVar14->functionScope->dataSize;
    local_188.head = (ExprBase *)0x0;
    local_188.tail = (ExprBase *)0x0;
    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    ExprVariableAccess::ExprVariableAccess
              ((ExprVariableAccess *)CONCAT44(extraout_var_03,iVar8),pSVar11,(TypeBase *)this_00,
               *(VariableData **)((long)(local_178.tail)->variable + 8));
    iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pp_Var18 = (_func_int **)CONCAT44(extraout_var_04,iVar9);
    pTVar10 = ctx->typeInt;
    *(undefined4 *)(pp_Var18 + 1) = 0x12;
    pp_Var18[2] = (_func_int *)pSVar11;
    pp_Var18[3] = (_func_int *)pTVar10;
    pp_Var18[4] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var18 + 5) = 0;
    *pp_Var18 = (_func_int *)&PTR__ExprBase_002239e8;
    pp_Var18[6] = (_func_int *)CONCAT44(extraout_var_03,iVar8);
    *(undefined4 *)(pp_Var18 + 7) = 0xd;
    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar19 = (ExprBase *)CONCAT44(extraout_var_05,iVar8);
    pTVar10 = ctx->typeVoid;
    pSVar20 = (SynBase *)CreateFunctionUpvalueClose(ctx,pSVar11,pFVar14,ctx->scope);
    pEVar19->typeID = 0x1c;
    pEVar19->source = pSVar11;
    pEVar19->type = pTVar10;
    pEVar19->next = (ExprBase *)0x0;
    pEVar19->listed = false;
    pEVar19->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223b70;
    pEVar19[1]._vptr_ExprBase = pp_Var18;
    *(undefined8 *)&pEVar19[1].typeID = 0;
    pEVar19[1].source = pSVar20;
    IntrusiveList<ExprBase>::push_back(&local_188,pEVar19);
    ClosePendingUpvalues(ctx,pFVar14);
    ExpressionContext::PopScope(ctx,SCOPE_FUNCTION,true);
    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x78);
    pEVar19 = (ExprBase *)CONCAT44(extraout_var_06,iVar8);
    pTVar13 = pFVar14->type;
    local_158 = (SynBase *)local_178.head;
    pTStack_150 = (TypeBase *)local_178.tail;
    local_148 = local_188.head;
    pEStack_140 = local_188.tail;
    pEVar19->typeID = 0x24;
    pEVar19->source = pSVar11;
    pEVar19->type = &pTVar13->super_TypeBase;
    pEVar19->next = (ExprBase *)0x0;
    pEVar19->listed = false;
    pEVar19->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223ba8;
    pEVar19[1]._vptr_ExprBase = (_func_int **)pFVar14;
    *(ExprVariableDefinition **)&pEVar19[1].typeID = pEVar17;
    pEVar19[1].source = (SynBase *)local_178.head;
    pEVar19[1].type = (TypeBase *)local_178.tail;
    pEVar19[1].next = (ExprBase *)0x0;
    *(ExprBase **)&pEVar19[1].listed = local_188.head;
    pEVar19[2]._vptr_ExprBase = (_func_int **)local_188.tail;
    *(undefined8 *)&pEVar19[2].typeID = 0;
    pEVar19[2].source = (SynBase *)0x0;
    pFVar14->declaration = pEVar19;
    this = &ctx->definitions;
    uVar7 = (ctx->definitions).count;
    if (uVar7 == (ctx->definitions).max) {
      SmallArray<ExprBase_*,_128U>::grow(this,uVar7);
    }
    if (this->data != (ExprBase **)0x0) {
      pEVar19 = pFVar14->declaration;
      uVar7 = (ctx->definitions).count;
      (ctx->definitions).count = uVar7 + 1;
      this->data[uVar7] = pEVar19;
      SmallArray<ArgumentData,_1U>::~SmallArray(&local_1d0);
      local_1d0.allocator = ctx->allocator;
      local_1d0.little[0].source = (SynBase *)0x0;
      local_1d0.little[0].isExplicit = false;
      local_1d0.little[0].name = (SynIdentifier *)0x0;
      local_1d0.little[0].type = (TypeBase *)0x0;
      local_1d0.little[0].value = (ExprBase *)0x0;
      local_1d0.little[0].valueFunction = (FunctionData *)0x0;
      local_1d0.data = local_1d0.little;
      local_1d0.count = 0;
      local_1d0.max = 1;
      iVar8 = (*(local_1d0.allocator)->_vptr_Allocator[2])(local_1d0.allocator,0x50);
      pSVar12 = (SynIdentifier *)CONCAT44(extraout_var_07,iVar8);
      (pSVar12->super_SynBase).typeID = 4;
      (pSVar12->super_SynBase).begin = (Lexeme *)0x0;
      (pSVar12->super_SynBase).end = (Lexeme *)0x0;
      (pSVar12->super_SynBase).pos.begin = (char *)0x0;
      (pSVar12->super_SynBase).pos.end = (char *)0x0;
      *(undefined8 *)((long)&(pSVar12->super_SynBase).pos.end + 2) = 0;
      *(undefined8 *)((long)&(pSVar12->super_SynBase).next + 2) = 0;
      (pSVar12->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002222c0;
      (pSVar12->name).begin = "$x";
      (pSVar12->name).end = "";
      pTVar10 = ctx->typeInt;
      if (local_1d0.count == local_1d0.max) {
        SmallArray<ArgumentData,_1U>::grow(&local_1d0,local_1d0.count);
      }
      if (local_1d0.data == (ArgumentData *)0x0) goto LAB_0016b545;
      uVar16 = (ulong)local_1d0.count;
      local_1d0.count = local_1d0.count + 1;
      local_1d0.data[uVar16].source = pSVar11;
      local_1d0.data[uVar16].isExplicit = false;
      local_1d0.data[uVar16].name = pSVar12;
      local_1d0.data[uVar16].type = pTVar10;
      local_1d0.data[uVar16].value = (ExprBase *)0x0;
      (&local_1d0.data[uVar16].value)[1] = (ExprBase *)0x0;
      local_168 = this;
      local_138 = pEVar19;
      iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pSVar12 = (SynIdentifier *)CONCAT44(extraout_var_08,iVar8);
      (pSVar12->super_SynBase).typeID = 4;
      (pSVar12->super_SynBase).begin = (Lexeme *)0x0;
      (pSVar12->super_SynBase).end = (Lexeme *)0x0;
      (pSVar12->super_SynBase).pos.begin = (char *)0x0;
      (pSVar12->super_SynBase).pos.end = (char *)0x0;
      *(undefined8 *)((long)&(pSVar12->super_SynBase).pos.end + 2) = 0;
      *(undefined8 *)((long)&(pSVar12->super_SynBase).next + 2) = 0;
      (pSVar12->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002222c0;
      (pSVar12->name).begin = local_128;
      (pSVar12->name).end = local_130;
      arguments_02.count = local_1d0.count;
      arguments_02.data = local_1d0.data;
      arguments_02._12_4_ = 0;
      pTVar13 = ExpressionContext::GetFunctionType(ctx,pSVar11,(TypeBase *)this_00,arguments_02);
      iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x338);
      pFVar14 = (FunctionData *)CONCAT44(extraout_var_09,iVar8);
      pAVar2 = ctx->allocator;
      pSVar21 = ctx->scope;
      pTVar15 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
      local_118 = 0;
      uStack_110 = 0;
      uVar7 = ctx->uniqueFunctionId;
      ctx->uniqueFunctionId = uVar7 + 1;
      pcVar22 = (char *)0x0;
      FunctionData::FunctionData
                (pFVar14,pAVar2,pSVar11,pSVar21,false,false,false,pTVar13,&pTVar15->super_TypeBase,
                 pSVar12,(IntrusiveList<MatchData>)ZEXT816(0),uVar7);
      if (local_1d0.count != 0) {
        uVar24 = 0;
        uVar16 = uVar24;
        do {
          puVar23 = (undefined8 *)((long)&(local_1d0.data)->source + uVar24);
          uVar7 = (pFVar14->arguments).count;
          if (uVar7 == (pFVar14->arguments).max) {
            SmallArray<ArgumentData,_4U>::grow(&pFVar14->arguments,uVar7);
          }
          pAVar3 = (pFVar14->arguments).data;
          if (pAVar3 == (ArgumentData *)0x0) goto LAB_0016b526;
          uVar7 = (pFVar14->arguments).count;
          (pFVar14->arguments).count = uVar7 + 1;
          pSVar20 = (SynBase *)*puVar23;
          uVar5 = puVar23[1];
          pSVar12 = (SynIdentifier *)puVar23[2];
          pTVar10 = (TypeBase *)puVar23[3];
          pFVar6 = (FunctionData *)puVar23[5];
          pAVar3[uVar7].value = (ExprBase *)puVar23[4];
          (&pAVar3[uVar7].value)[1] = (ExprBase *)pFVar6;
          pAVar3[uVar7].name = pSVar12;
          (&pAVar3[uVar7].name)[1] = (SynIdentifier *)pTVar10;
          pAVar3[uVar7].source = pSVar20;
          *(undefined8 *)&pAVar3[uVar7].isExplicit = uVar5;
          uVar16 = uVar16 + 1;
          uVar24 = uVar24 + 0x30;
        } while (uVar16 < local_1d0.count);
      }
      name_00.end = pcVar22;
      name_00.begin = (pFVar14->name->name).end;
      anon_unknown.dwarf_9c70f::CheckFunctionConflict
                ((anon_unknown_dwarf_9c70f *)ctx,(ExpressionContext *)syntax,
                 (SynBase *)(pFVar14->name->name).begin,name_00);
      ExpressionContext::AddFunction(ctx,pFVar14);
      ExpressionContext::PushScope(ctx,pFVar14);
      pFVar14->functionScope = ctx->scope;
      local_178.head = (ExprVariableDefinition *)0x0;
      local_178.tail = (ExprVariableDefinition *)0x0;
      arguments_03.count = local_1d0.count;
      arguments_03.data = local_1d0.data;
      arguments_03._12_4_ = 0;
      CreateFunctionArgumentVariables(ctx,pSVar11,pFVar14,arguments_03,&local_178);
      pEVar17 = CreateFunctionContextArgument(ctx,pSVar11,pFVar14);
      pFVar14->argumentsSize = pFVar14->functionScope->dataSize;
      local_188.head = (ExprBase *)0x0;
      local_188.tail = (ExprBase *)0x0;
      iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      ExprVariableAccess::ExprVariableAccess
                ((ExprVariableAccess *)CONCAT44(extraout_var_10,iVar8),pSVar11,ctx->typeInt,
                 *(VariableData **)((long)(local_178.tail)->variable + 8));
      iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pp_Var18 = (_func_int **)CONCAT44(extraout_var_11,iVar9);
      *(undefined4 *)(pp_Var18 + 1) = 0x12;
      pp_Var18[2] = (_func_int *)pSVar11;
      pp_Var18[3] = (_func_int *)this_00;
      pp_Var18[4] = (_func_int *)0x0;
      *(undefined1 *)(pp_Var18 + 5) = 0;
      *pp_Var18 = (_func_int *)&PTR__ExprBase_002239e8;
      pp_Var18[6] = (_func_int *)CONCAT44(extraout_var_10,iVar8);
      *(undefined4 *)(pp_Var18 + 7) = 0xd;
      iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pEVar19 = (ExprBase *)CONCAT44(extraout_var_12,iVar8);
      pTVar10 = ctx->typeVoid;
      pSVar20 = (SynBase *)CreateFunctionUpvalueClose(ctx,pSVar11,pFVar14,ctx->scope);
      pEVar19->typeID = 0x1c;
      pEVar19->source = pSVar11;
      pEVar19->type = pTVar10;
      pEVar19->next = (ExprBase *)0x0;
      pEVar19->listed = false;
      pEVar19->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223b70;
      pEVar19[1]._vptr_ExprBase = pp_Var18;
      *(undefined8 *)&pEVar19[1].typeID = 0;
      pEVar19[1].source = pSVar20;
      IntrusiveList<ExprBase>::push_back(&local_188,pEVar19);
      ClosePendingUpvalues(ctx,pFVar14);
      ExpressionContext::PopScope(ctx,SCOPE_FUNCTION,true);
      iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x78);
      pEVar19 = (ExprBase *)CONCAT44(extraout_var_13,iVar8);
      pTVar13 = pFVar14->type;
      local_158 = (SynBase *)local_178.head;
      pTStack_150 = (TypeBase *)local_178.tail;
      local_148 = local_188.head;
      pEStack_140 = local_188.tail;
      pEVar19->typeID = 0x24;
      pEVar19->source = pSVar11;
      pEVar19->type = &pTVar13->super_TypeBase;
      pEVar19->next = (ExprBase *)0x0;
      pEVar19->listed = false;
      pEVar19->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223ba8;
      pEVar19[1]._vptr_ExprBase = (_func_int **)pFVar14;
      *(ExprVariableDefinition **)&pEVar19[1].typeID = pEVar17;
      pEVar19[1].source = (SynBase *)local_178.head;
      pEVar19[1].type = (TypeBase *)local_178.tail;
      pEVar19[1].next = (ExprBase *)0x0;
      *(ExprBase **)&pEVar19[1].listed = local_188.head;
      pEVar19[2]._vptr_ExprBase = (_func_int **)local_188.tail;
      *(undefined8 *)&pEVar19[2].typeID = 0;
      pEVar19[2].source = (SynBase *)0x0;
      pFVar14->declaration = pEVar19;
      uVar7 = (ctx->definitions).count;
      if (uVar7 == (ctx->definitions).max) {
        SmallArray<ExprBase_*,_128U>::grow(local_168,uVar7);
      }
      ppEVar4 = local_168->data;
      if (ppEVar4 != (ExprBase **)0x0) {
        pSVar11 = (SynBase *)pFVar14->declaration;
        uVar7 = (ctx->definitions).count;
        (ctx->definitions).count = uVar7 + 1;
        ppEVar4[uVar7] = (ExprBase *)pSVar11;
        SmallArray<ArgumentData,_1U>::~SmallArray(&local_1d0);
        ctx->scope = local_160;
        ctx->lookupLocation = (SynBase *)0x0;
        memcpy(local_120,local_f8,200);
        ctx->errorHandlerNested = bVar1;
        iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
        pEVar19 = (ExprBase *)CONCAT44(extraout_var_14,iVar8);
        pTVar10 = ctx->typeVoid;
        pEVar19->typeID = 0x2e;
        pEVar19->source = &syntax->super_SynBase;
        pEVar19->type = pTVar10;
        pEVar19->next = (ExprBase *)0x0;
        pEVar19->listed = false;
        pEVar19->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00224238;
        pEVar19[1]._vptr_ExprBase = (_func_int **)this_00;
        *(ExprBase **)&pEVar19[1].typeID = local_138;
        pEVar19[1].source = pSVar11;
        return pEVar19;
      }
    }
    pcVar22 = "void SmallArray<ExprBase *, 128>::push_back(const T &) [T = ExprBase *, N = 128]";
  }
LAB_0016b53b:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,pcVar22);
LAB_0016b526:
  pcVar22 = "void SmallArray<ArgumentData, 4>::push_back(const T &) [T = ArgumentData, N = 4]";
  goto LAB_0016b53b;
}

Assistant:

ExprBase* AnalyzeEnumDefinition(ExpressionContext &ctx, SynEnumDefinition *syntax)
{
	CheckTypeConflict(ctx, syntax, syntax->name->name);

	InplaceStr typeName = GetTypeNameInScope(ctx, ctx.scope, syntax->name->name);

	if(LookupTypeByName(ctx, typeName.hash()) != NULL)
		Stop(ctx, syntax, "ERROR: '%.*s' is being redefined", FMT_ISTR(syntax->name->name));

	TypeEnum *enumType = new (ctx.get<TypeEnum>()) TypeEnum(SynIdentifier(syntax->name, typeName), syntax, ctx.scope);

	ctx.AddType(enumType);

	ctx.PushScope(enumType);

	enumType->typeScope = ctx.scope;

	AnalyzeEnumConstants(ctx, enumType, syntax->values, enumType->constants);

	enumType->alignment = ctx.typeInt->alignment;

	ctx.PopScope(SCOPE_TYPE);
	
	ScopeData *scope = ctx.scope;

	// Switch to global scope
	ctx.SwitchToScopeAtPoint(ctx.globalScope, NULL);

	ExprBase *castToInt = NULL;
	ExprBase *castToEnum = NULL;

	jmp_buf prevErrorHandler;
	memcpy(&prevErrorHandler, &ctx.errorHandler, sizeof(jmp_buf));

	bool prevErrorHandlerNested = ctx.errorHandlerNested;
	ctx.errorHandlerNested = true;

	unsigned traceDepth = NULLC::TraceGetDepth();

	if(!setjmp(ctx.errorHandler))
	{
		SynBase *syntaxInternal = ctx.MakeInternal(syntax);

		// Create conversion operator int int(enum_type)
		{
			SmallArray<ArgumentData, 1> arguments(ctx.allocator);
			arguments.push_back(ArgumentData(syntaxInternal, false, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$x")), enumType, NULL));

			SynIdentifier *functionNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("int"));

			TypeFunction *typeFunction = ctx.GetFunctionType(syntaxInternal, ctx.typeInt, arguments);

			FunctionData *function = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, syntaxInternal, ctx.scope, false, false, false, typeFunction, ctx.GetReferenceType(ctx.typeVoid), functionNameIdentifier, IntrusiveList<MatchData>(), ctx.uniqueFunctionId++);

			// Fill in argument data
			for(unsigned i = 0; i < arguments.size(); i++)
				function->arguments.push_back(arguments[i]);

			CheckFunctionConflict(ctx, syntax, function->name->name);

			ctx.AddFunction(function);

			ctx.PushScope(function);

			function->functionScope = ctx.scope;

			IntrusiveList<ExprVariableDefinition> variables;

			CreateFunctionArgumentVariables(ctx, syntaxInternal, function, arguments, variables);

			ExprVariableDefinition *contextArgumentDefinition = CreateFunctionContextArgument(ctx, syntaxInternal, function);

			function->argumentsSize = function->functionScope->dataSize;

			IntrusiveList<ExprBase> expressions;

			ExprBase *access = new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(syntaxInternal, enumType, variables.tail->variable->variable);
			ExprBase *cast = new (ctx.get<ExprTypeCast>()) ExprTypeCast(syntaxInternal, ctx.typeInt, access, EXPR_CAST_REINTERPRET);

			expressions.push_back(new (ctx.get<ExprReturn>()) ExprReturn(syntaxInternal, ctx.typeVoid, cast, NULL, CreateFunctionUpvalueClose(ctx, syntaxInternal, function, ctx.scope)));

			ClosePendingUpvalues(ctx, function);

			ctx.PopScope(SCOPE_FUNCTION);

			function->declaration = new (ctx.get<ExprFunctionDefinition>()) ExprFunctionDefinition(syntaxInternal, function->type, function, contextArgumentDefinition, variables, NULL, expressions, NULL, NULL);

			ctx.definitions.push_back(function->declaration);

			castToInt = function->declaration;
		}

		// Create conversion operator enum_type enum_type(int)
		{
			SmallArray<ArgumentData, 1> arguments(ctx.allocator);
			arguments.push_back(ArgumentData(syntaxInternal, false, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$x")), ctx.typeInt, NULL));

			SynIdentifier *functionNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(typeName);

			TypeFunction *typeFunction = ctx.GetFunctionType(syntaxInternal, enumType, arguments);

			FunctionData *function = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, syntaxInternal, ctx.scope, false, false, false, typeFunction, ctx.GetReferenceType(ctx.typeVoid), functionNameIdentifier, IntrusiveList<MatchData>(), ctx.uniqueFunctionId++);

			// Fill in argument data
			for(unsigned i = 0; i < arguments.size(); i++)
				function->arguments.push_back(arguments[i]);

			CheckFunctionConflict(ctx, syntax, function->name->name);

			ctx.AddFunction(function);

			ctx.PushScope(function);

			function->functionScope = ctx.scope;

			IntrusiveList<ExprVariableDefinition> variables;

			CreateFunctionArgumentVariables(ctx, syntaxInternal, function, arguments, variables);

			ExprVariableDefinition *contextArgumentDefinition = CreateFunctionContextArgument(ctx, syntaxInternal, function);

			function->argumentsSize = function->functionScope->dataSize;

			IntrusiveList<ExprBase> expressions;

			ExprBase *access = new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(syntaxInternal, ctx.typeInt, variables.tail->variable->variable);
			ExprBase *cast = new (ctx.get<ExprTypeCast>()) ExprTypeCast(syntaxInternal, enumType, access, EXPR_CAST_REINTERPRET);

			expressions.push_back(new (ctx.get<ExprReturn>()) ExprReturn(syntaxInternal, ctx.typeVoid, cast, NULL, CreateFunctionUpvalueClose(ctx, syntaxInternal, function, ctx.scope)));

			ClosePendingUpvalues(ctx, function);

			ctx.PopScope(SCOPE_FUNCTION);

			function->declaration = new (ctx.get<ExprFunctionDefinition>()) ExprFunctionDefinition(syntaxInternal, function->type, function, contextArgumentDefinition, variables, NULL, expressions, NULL, NULL);

			ctx.definitions.push_back(function->declaration);

			castToEnum = function->declaration;
		}
	}
	else
	{
		NULLC::TraceLeaveTo(traceDepth);

		// Restore old scope
		ctx.SwitchToScopeAtPoint(scope, NULL);

		memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
		ctx.errorHandlerNested = prevErrorHandlerNested;

		longjmp(ctx.errorHandler, 1);
	}

	// Restore old scope
	ctx.SwitchToScopeAtPoint(scope, NULL);

	memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
	ctx.errorHandlerNested = prevErrorHandlerNested;

	return new (ctx.get<ExprEnumDefinition>()) ExprEnumDefinition(syntax, ctx.typeVoid, enumType, castToInt, castToEnum);
}